

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O1

void __thiscall CItems::OnRender(CItems *this)

{
  IClient *pIVar1;
  CGameClient *pCVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  CSnapItem Item;
  int local_44;
  int local_40;
  long local_38;
  CNetObj_Projectile *pCurrent;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pClient;
  if (2 < pIVar1->m_State) {
    uVar8 = 0;
    uVar3 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x1e])(pIVar1,0);
    if (0 < (int)uVar3) {
      do {
        pIVar1 = ((this->super_CComponent).m_pClient)->m_pClient;
        iVar4 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x20])(pIVar1,0,uVar8,&local_44);
        pCurrent = (CNetObj_Projectile *)CONCAT44(extraout_var,iVar4);
        if (local_44 == 4) {
          iVar4 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                    _vptr_IInterface[0x1f])();
          if ((CNetObj_Pickup *)CONCAT44(extraout_var_00,iVar4) != (CNetObj_Pickup *)0x0) {
            RenderPickup(this,(CNetObj_Pickup *)CONCAT44(extraout_var_00,iVar4),
                         (CNetObj_Pickup *)pCurrent);
          }
        }
        else if (local_44 == 3) {
          RenderLaser(this,(CNetObj_Laser *)pCurrent);
        }
        else if (local_44 == 2) {
          RenderProjectile(this,pCurrent,local_40);
        }
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar3 != uVar7);
    }
    if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        pIVar1 = ((this->super_CComponent).m_pClient)->m_pClient;
        iVar4 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x20])(pIVar1,0,uVar8,&local_44);
        if (local_44 == 5) {
          iVar5 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                    _vptr_IInterface[0x1f])();
          if ((CNetObj_Flag *)CONCAT44(extraout_var_02,iVar5) != (CNetObj_Flag *)0x0) {
            pCVar2 = (this->super_CComponent).m_pClient;
            pIVar1 = pCVar2->m_pClient;
            iVar6 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x1f])
                              (pIVar1,1,8,(ulong)(uint)(pCVar2->m_Snap).m_GameDataFlagSnapID);
            RenderFlag(this,(CNetObj_Flag *)CONCAT44(extraout_var_02,iVar5),
                       (CNetObj_Flag *)CONCAT44(extraout_var_01,iVar4),
                       (CNetObj_GameDataFlag *)CONCAT44(extraout_var_03,iVar6),
                       (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataFlag);
          }
        }
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar3 != uVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CItems::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
		return;

	int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
	for(int i = 0; i < Num; i++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

		if(Item.m_Type == NETOBJTYPE_PROJECTILE)
		{
			RenderProjectile((const CNetObj_Projectile *)pData, Item.m_ID);
		}
		else if(Item.m_Type == NETOBJTYPE_PICKUP)
		{
			const void *pPrev = Client()->SnapFindItem(IClient::SNAP_PREV, Item.m_Type, Item.m_ID);
			if(pPrev)
				RenderPickup((const CNetObj_Pickup *)pPrev, (const CNetObj_Pickup *)pData);
		}
		else if(Item.m_Type == NETOBJTYPE_LASER)
		{
			RenderLaser((const CNetObj_Laser *)pData);
		}
	}

	// render flag
	for(int i = 0; i < Num; i++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

		if(Item.m_Type == NETOBJTYPE_FLAG)
		{
			const void *pPrev = Client()->SnapFindItem(IClient::SNAP_PREV, Item.m_Type, Item.m_ID);
			if(pPrev)
			{
				const void *pPrevGameDataFlag = Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_GAMEDATAFLAG, m_pClient->m_Snap.m_GameDataFlagSnapID);
				RenderFlag(static_cast<const CNetObj_Flag *>(pPrev), static_cast<const CNetObj_Flag *>(pData),
							static_cast<const CNetObj_GameDataFlag *>(pPrevGameDataFlag), m_pClient->m_Snap.m_pGameDataFlag);
			}
		}
	}
}